

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall leveldb::FindFileTest_Empty_Test::TestBody(FindFileTest_Empty_Test *this)

{
  undefined8 *puVar1;
  char cVar2;
  bool bVar3;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_68;
  Message local_60;
  undefined8 *local_58;
  AssertHelper local_50;
  string local_48;
  
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"foo");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"0","Find(\"foo\")",(int *)&local_60,(int *)&local_68);
  cVar2 = (char)local_48._M_dataplus._M_p;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_60);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)CONCAT44(local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)local_48._M_string_length);
  }
  if (cVar2 != '\0') {
    bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a","z");
    local_60.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_60.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,!bVar3);
    local_58 = (undefined8 *)0x0;
    if (bVar3) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&local_60,(AssertionResult *)"!Overlaps(\"a\", \"z\")",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                 ,0x38,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                        (char)local_48._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
      }
      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) + 8))();
      }
    }
    puVar1 = local_58;
    if (local_58 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_58 != local_58 + 2) {
        operator_delete((undefined8 *)*local_58);
      }
      operator_delete(puVar1);
    }
    if (!bVar3) {
      bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,"z");
      local_60.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_60.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,!bVar3);
      local_58 = (undefined8 *)0x0;
      if (bVar3) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_48,(internal *)&local_60,(AssertionResult *)"!Overlaps(nullptr, \"z\")",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                   ,0x39,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                          (char)local_48._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
            &local_48.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p))
          ;
        }
        if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) + 8))();
        }
      }
      puVar1 = local_58;
      if (local_58 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(puVar1);
      }
      if (!bVar3) {
        bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a",(char *)0x0);
        local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_60.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,!bVar3);
        local_58 = (undefined8 *)0x0;
        if (bVar3) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_48,(internal *)&local_60,(AssertionResult *)"!Overlaps(\"a\", nullptr)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                     ,0x3a,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                            (char)local_48._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
              &local_48.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p
                                    ));
          }
          if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) + 8))();
          }
        }
        puVar1 = local_58;
        if (local_58 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_58 != local_58 + 2) {
            operator_delete((undefined8 *)*local_58);
          }
          operator_delete(puVar1);
        }
        if (!bVar3) {
          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,(char *)0x0);
          local_60.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               CONCAT31(local_60.ss_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._1_3_,!bVar3);
          local_58 = (undefined8 *)0x0;
          if (bVar3) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_48,(internal *)&local_60,
                       (AssertionResult *)"!Overlaps(nullptr, nullptr)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                       ,0x3b,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                              (char)local_48._M_dataplus._M_p));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                &local_48.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                       (char)local_48._M_dataplus._M_p));
            }
            if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_) + 8))();
            }
          }
          puVar1 = local_58;
          if (local_58 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_58 != local_58 + 2) {
              operator_delete((undefined8 *)*local_58);
            }
            operator_delete(puVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(FindFileTest, Empty) {
  ASSERT_EQ(0, Find("foo"));
  ASSERT_TRUE(!Overlaps("a", "z"));
  ASSERT_TRUE(!Overlaps(nullptr, "z"));
  ASSERT_TRUE(!Overlaps("a", nullptr));
  ASSERT_TRUE(!Overlaps(nullptr, nullptr));
}